

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

bool * __thiscall
google::protobuf::internal::UntypedMapBase::GetKey<bool>(UntypedMapBase *this,NodeBase *node)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  
  bVar1 = (this->type_info_).field_0x3;
  if ((bVar1 & 0xf) == 0) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(ulong)bVar1 & 0xf,
                        "static_cast<int>(StaticTypeKind<T>()) == static_cast<int>(type_info_.key_type)"
                       );
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    return (bool *)(node + 1);
  }
  GetKey<bool>();
}

Assistant:

T* GetKey(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.key_type));
    return reinterpret_cast<T*>(node->GetVoidKey());
  }